

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int argc_00;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  bool collapse;
  string local_bd0 [32];
  undefined1 local_bb0 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_a30 [4];
  int res;
  string output;
  value_type local_a08;
  int local_9e4;
  undefined1 local_9e0 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_9c0;
  cmCTestScriptHandler *local_9a0;
  cmCTestScriptHandler *ch;
  cmDocumentation doc;
  undefined1 local_8d0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_758 [32];
  undefined1 local_738 [8];
  ostringstream cmCTestLog_msg;
  string local_5c0;
  undefined1 local_5a0 [8];
  cmCTest inst;
  undefined1 local_30 [8];
  CommandLineArguments encoding_args;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = argv;
  cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)local_30,argc,argv);
  argc_00 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)local_30);
  encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)local_30);
  cmSystemTools::DoNotInheritStdPipes();
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources
            (*encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((1 < argc_00) &&
     (iVar3 = strcmp(encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage[1],"--launch"), iVar3 == 0)) {
    argv_local._4_4_ =
         cmCTestLaunch::Main(argc_00,encoding_args.argv_.
                                     super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
    inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    goto LAB_0052be72;
  }
  cmCTest::cmCTest((cmCTest *)local_5a0);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_5c0,(SystemTools *)0x1,collapse);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_5c0);
  if ((bVar1 & 1) == 0) {
    if ((1 < argc_00) ||
       ((bVar2 = cmsys::SystemTools::FileExists("CTestTestfile.cmake"), !bVar2 &&
        (bVar2 = cmsys::SystemTools::FileExists("DartTestfile.txt"), !bVar2)))) {
      if (argc_00 == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8d0);
        poVar4 = std::operator<<((ostream *)local_8d0,"*********************************");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"No test configuration file found!");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"*********************************");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log((cmCTest *)local_5a0,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                     ,0xa9,pcVar5,false);
        std::__cxx11::string::~string((string *)&doc.Formatter.TextIndent);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8d0);
      }
      cmDocumentation::cmDocumentation((cmDocumentation *)&ch);
      cmDocumentation::addCTestStandardDocSections((cmDocumentation *)&ch);
      inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
           cmDocumentation::CheckOptions
                     ((cmDocumentation *)&ch,argc_00,
                      encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(char *)0x0);
      if (inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_) {
        local_9a0 = (cmCTestScriptHandler *)cmCTest::GetHandler((cmCTest *)local_5a0,"script");
        cmCTestScriptHandler::CreateCMake(local_9a0);
        cmDocumentation::SetShowGenerators((cmDocumentation *)&ch,false);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_9c0,"ctest",
                   (allocator *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmDocumentation::SetName((cmDocumentation *)&ch,&local_9c0);
        std::__cxx11::string::~string((string *)&local_9c0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmDocumentation::SetSection((cmDocumentation *)&ch,"Name",cmDocumentationName);
        cmDocumentation::SetSection((cmDocumentation *)&ch,"Usage",cmDocumentationUsage);
        cmDocumentation::PrependSection((cmDocumentation *)&ch,"Options",cmDocumentationOptions);
        bVar2 = cmDocumentation::PrintRequestedDocumentation
                          ((cmDocumentation *)&ch,(ostream *)&std::cout);
        argv_local._4_4_ = (uint)!bVar2;
      }
      inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count._1_3_ = 0;
      cmDocumentation::~cmDocumentation((cmDocumentation *)&ch);
      if ((uint)inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
      goto LAB_0052be56;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_9e0);
    for (local_9e4 = 0; local_9e4 < argc_00; local_9e4 = local_9e4 + 1) {
      pcVar5 = encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[local_9e4];
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a08,pcVar5,(allocator *)(output.field_2._M_local_buf + 0xf));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_9e0,&local_a08);
      std::__cxx11::string::~string((string *)&local_a08);
      std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::string((string *)local_a30);
    argv_local._4_4_ =
         cmCTest::Run((cmCTest *)local_5a0,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_9e0,(string *)local_a30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bb0);
    std::operator<<((ostream *)local_bb0,(string *)local_a30);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log((cmCTest *)local_5a0,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                 ,0xc4,pcVar5,false);
    std::__cxx11::string::~string(local_bd0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bb0);
    inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    std::__cxx11::string::~string((string *)local_a30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_9e0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_738);
    poVar4 = std::operator<<((ostream *)local_738,"Current working directory cannot be established."
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log((cmCTest *)local_5a0,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                 ,0x9b,pcVar5,false);
    std::__cxx11::string::~string(local_758);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_738);
    argv_local._4_4_ = 1;
    inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
LAB_0052be56:
  cmCTest::~cmCTest((cmCTest *)local_5a0);
LAB_0052be72:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const* const* argv)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::DoNotInheritStdPipes();
  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(argv[0]);

  // Dispatch 'ctest --launch' mode directly.
  if (argc >= 2 && strcmp(argv[1], "--launch") == 0) {
    return cmCTestLaunch::Main(argc, argv);
  }

  cmCTest inst;

  if (cmSystemTools::GetCurrentWorkingDirectory().empty()) {
    cmCTestLog(&inst, ERROR_MESSAGE,
               "Current working directory cannot be established."
                 << std::endl);
    return 1;
  }

  // If there is a testing input file, check for documentation options
  // only if there are actually arguments.  We want running without
  // arguments to run tests.
  if (argc > 1 ||
      !(cmSystemTools::FileExists("CTestTestfile.cmake") ||
        cmSystemTools::FileExists("DartTestfile.txt"))) {
    if (argc == 1) {
      cmCTestLog(&inst, ERROR_MESSAGE, "*********************************"
                   << std::endl
                   << "No test configuration file found!" << std::endl
                   << "*********************************" << std::endl);
    }
    cmDocumentation doc;
    doc.addCTestStandardDocSections();
    if (doc.CheckOptions(argc, argv)) {
      // Construct and print requested documentation.
      cmCTestScriptHandler* ch =
        static_cast<cmCTestScriptHandler*>(inst.GetHandler("script"));
      ch->CreateCMake();

      doc.SetShowGenerators(false);
      doc.SetName("ctest");
      doc.SetSection("Name", cmDocumentationName);
      doc.SetSection("Usage", cmDocumentationUsage);
      doc.PrependSection("Options", cmDocumentationOptions);
      return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
    }
  }

  // copy the args to a vector
  std::vector<std::string> args;
  for (int i = 0; i < argc; ++i) {
    args.push_back(argv[i]);
  }
  // run ctest
  std::string output;
  int res = inst.Run(args, &output);
  cmCTestLog(&inst, OUTPUT, output);

  return res;
}